

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O3

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeValueFunctor,short,std::unordered_map<short,unsigned_long,std::hash<short>,std::equal_to<short>,std::allocator<std::pair<short_const,unsigned_long>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  idx_t iVar5;
  idx_t iVar6;
  long lVar7;
  ulong uVar8;
  undefined8 *puVar9;
  long lVar10;
  UnifiedVectorFormat sdata;
  long *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  uVar4 = duckdb::ListVector::GetListSize(result);
  if (count == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    iVar5 = 0;
    do {
      iVar6 = iVar5;
      if (*local_68 != 0) {
        iVar6 = (idx_t)*(uint *)(*local_68 + iVar5 * 4);
      }
      lVar1 = **(long **)(local_60 + iVar6 * 8);
      if (lVar1 != 0) {
        lVar7 = lVar7 + *(long *)(lVar1 + 0x18);
      }
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  duckdb::ListVector::Reserve(result,lVar7 + uVar4);
  lVar7 = duckdb::ListVector::GetEntry(result);
  if (count != 0) {
    lVar1 = *(long *)(result + 0x20);
    lVar2 = *local_68;
    lVar7 = *(long *)(lVar7 + 0x20);
    iVar5 = 0;
    do {
      iVar6 = iVar5;
      if (lVar2 != 0) {
        iVar6 = (idx_t)*(uint *)(lVar2 + iVar5 * 4);
      }
      plVar3 = *(long **)(local_60 + iVar6 * 8);
      *(ulong *)(lVar1 + iVar5 * 0x10) = uVar4;
      lVar10 = *plVar3;
      if (lVar10 == 0) {
        lVar10 = 0;
      }
      else {
        uVar8 = uVar4;
        for (puVar9 = *(undefined8 **)(lVar10 + 0x10); puVar9 != (undefined8 *)0x0;
            puVar9 = (undefined8 *)*puVar9) {
          *(undefined2 *)(lVar7 + uVar8 * 2) = *(undefined2 *)(puVar9 + 1);
          uVar8 = uVar8 + 1;
        }
        lVar10 = uVar8 - uVar4;
        uVar4 = uVar8;
      }
      *(long *)(iVar5 * 0x10 + lVar1 + 8) = lVar10;
      iVar5 = iVar5 + 1;
    } while (iVar5 != count);
  }
  duckdb::ListVector::SetListSize(result,uVar4);
  duckdb::Vector::Verify((ulong)result);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}